

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_level.cpp
# Opt level: O2

void log_level_test(void)

{
  Logger *pLVar1;
  
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as debug----------------\n","info",
           "log_level_test",6);
  }
  g_log_level = LOG_LEVEL_DEBUG;
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",8);
  }
  if (-1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",8,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",9);
  }
  if (0 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",9,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",10);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",10,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0xb);
  }
  if (2 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0xb,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as info----------------\n","info",
           "log_level_test",0xd);
  }
  g_log_level = LOG_LEVEL_INFO;
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0xf);
  }
  if (-1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0xf,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x10);
  }
  if (0 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x10,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x11);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x11,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x12);
  }
  if (2 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x12,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as warn----------------\n","info",
           "log_level_test",0x14);
  }
  g_log_level = LOG_LEVEL_WARN;
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x16);
  }
  if (-1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x16,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x17);
  }
  if (0 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x17,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x18);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x18,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x19);
  }
  if (2 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x19,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as error----------------\n","info",
           "log_level_test",0x1b);
  }
  g_log_level = LOG_LEVEL_ERROR;
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x1d);
  }
  if (-1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x1d,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x1e);
  }
  if (0 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x1e,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x1f);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x1f,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x20);
  }
  if (2 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x20,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
    return;
  }
  return;
}

Assistant:

void log_level_test()
{
    PR_INFO("\n------------------set log level as debug----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_DEBUG);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");

    PR_INFO("\n------------------set log level as info----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_INFO);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");

    PR_INFO("\n------------------set log level as warn----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_WARN);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");

    PR_INFO("\n------------------set log level as error----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_ERROR);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");
}